

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::AddSymbol(std::basic_string_view<char,std::char_traits<char>>,void_const*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::Symbol)::__2,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  ulong uVar1;
  ulong uVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  undefined8 local_58;
  char *local_50;
  long local_48;
  long local_40;
  undefined8 local_38;
  char *local_30;
  ulong local_28;
  ulong local_20;
  undefined8 local_18;
  char *local_10;
  
  local_28 = **(ulong **)(this + 8);
  uVar1 = local_28 + 1;
  uVar2 = **(ulong **)this;
  local_48 = uVar2 - uVar1;
  if (uVar1 <= uVar2) {
    local_20 = (*(ulong **)this)[1];
    local_40 = uVar1 + local_20;
    if (uVar2 < local_28) {
      local_28 = uVar2;
    }
    local_58 = 1;
    local_50 = "\"";
    local_38 = 0x19;
    local_30 = "\" is already defined in \"";
    local_18 = 2;
    local_10 = "\".";
    pieces._M_len = (size_type)"\" is already defined in \"";
    pieces._M_array = (iterator)&DAT_00000005;
    strings_internal::CatPieces_abi_cxx11_
              (__return_storage_ptr__,(strings_internal *)&local_58,pieces);
    return __return_storage_ptr__;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}